

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

links_entry_conflict * next_entry(archive_entry_linkresolver *res,int mode)

{
  ulong local_30;
  size_t bucket;
  links_entry_conflict *le;
  int mode_local;
  archive_entry_linkresolver *res_local;
  
  if (res->spare != (links_entry_conflict *)0x0) {
    archive_entry_free(res->spare->canonical);
    archive_entry_free(res->spare->entry);
    free(res->spare);
    res->spare = (links_entry_conflict *)0x0;
  }
  local_30 = 0;
  do {
    if (res->number_buckets <= local_30) {
      return (links_entry_conflict *)0x0;
    }
    for (bucket = (size_t)res->buckets[local_30]; bucket != 0; bucket = *(size_t *)bucket) {
      if (((*(long *)(bucket + 0x18) == 0) || ((mode & 1U) != 0)) &&
         ((*(long *)(bucket + 0x18) != 0 || ((mode & 2U) != 0)))) {
        if (*(long *)bucket != 0) {
          *(undefined8 *)(*(long *)bucket + 8) = *(undefined8 *)(bucket + 8);
        }
        if (*(long *)(bucket + 8) == 0) {
          res->buckets[local_30] = *(links_entry_conflict **)bucket;
        }
        else {
          **(undefined8 **)(bucket + 8) = *(undefined8 *)bucket;
        }
        res->number_entries = res->number_entries - 1;
        res->spare = (links_entry_conflict *)bucket;
        return (links_entry_conflict *)bucket;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static struct links_entry *
next_entry(struct archive_entry_linkresolver *res, int mode)
{
	struct links_entry	*le;
	size_t			 bucket;

	/* Free a held entry. */
	if (res->spare != NULL) {
		archive_entry_free(res->spare->canonical);
		archive_entry_free(res->spare->entry);
		free(res->spare);
		res->spare = NULL;
	}

	/* Look for next non-empty bucket in the links cache. */
	for (bucket = 0; bucket < res->number_buckets; bucket++) {
		for (le = res->buckets[bucket]; le != NULL; le = le->next) {
			if (le->entry != NULL &&
			    (mode & NEXT_ENTRY_DEFERRED) == 0)
				continue;
			if (le->entry == NULL &&
			    (mode & NEXT_ENTRY_PARTIAL) == 0)
				continue;
			/* Remove it from this hash bucket. */
			if (le->next != NULL)
				le->next->previous = le->previous;
			if (le->previous != NULL)
				le->previous->next = le->next;
			else
				res->buckets[bucket] = le->next;
			res->number_entries--;
			/* Defer freeing this entry. */
			res->spare = le;
			return (le);
		}
	}
	return (NULL);
}